

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_main.c
# Opt level: O0

wchar_t canSymlink(void)

{
  int iVar1;
  wchar_t wVar2;
  bool local_d;
  wchar_t local_c;
  
  if (canSymlink::tested == L'\0') {
    canSymlink::tested = L'\x01';
    assertion_make_file("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/test_utils/test_main.c"
                        ,L'৉',"canSymlink.0",L'Ƥ',L'\x01',"a");
    iVar1 = symlink("canSymlink.0","canSymlink.1");
    local_d = false;
    if (iVar1 == 0) {
      wVar2 = is_symlink("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/test_utils/test_main.c"
                         ,L'৒',"canSymlink.1","canSymlink.0",L'\0');
      local_d = wVar2 != L'\0';
    }
    local_c = (wchar_t)local_d;
  }
  else {
    local_c = canSymlink::value;
  }
  canSymlink::value = local_c;
  return local_c;
}

Assistant:

int
canSymlink(void)
{
	/* Remember the test result */
	static int value = 0, tested = 0;
	if (tested)
		return (value);

	++tested;
	assertion_make_file(__FILE__, __LINE__, "canSymlink.0", 0644, 1, "a");
	/* Note: Cygwin has its own symlink() emulation that does not
	 * use the Win32 CreateSymbolicLink() function. */
#if defined(_WIN32) && !defined(__CYGWIN__)
	value = my_CreateSymbolicLinkA("canSymlink.1", "canSymlink.0", 0)
	    && is_symlink(__FILE__, __LINE__, "canSymlink.1", "canSymlink.0",
	    0);
#elif HAVE_SYMLINK
	value = (0 == symlink("canSymlink.0", "canSymlink.1"))
	    && is_symlink(__FILE__, __LINE__, "canSymlink.1","canSymlink.0",
	    0);
#endif
	return (value);
}